

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O2

void view_ability_display(menu_conflict *menu,int oid,_Bool cursor,int row,int col,int width)

{
  int iVar1;
  void *pvVar2;
  uint8_t uVar3;
  uint8_t attr;
  long lVar4;
  char buf [80];
  
  pvVar2 = menu->menu_data;
  lVar4 = (long)oid * 0x30;
  iVar1 = *(int *)((long)pvVar2 + lVar4 + 0x28);
  if (iVar1 == 3) {
    strnfmt(buf,0x50,"Class: %s",*(undefined8 *)((long)pvVar2 + lVar4 + 0x18));
    uVar3 = '\a';
  }
  else if (iVar1 == 2) {
    strnfmt(buf,0x50,"Racial: %s",*(undefined8 *)((long)pvVar2 + lVar4 + 0x18));
    uVar3 = '\x03';
  }
  else if (iVar1 == 1) {
    strnfmt(buf,0x50,"Specialty Ability: %s",*(undefined8 *)((long)pvVar2 + lVar4 + 0x18));
    uVar3 = '\x05';
  }
  else {
    my_strcpy(buf,"Mysterious",0x50);
    uVar3 = '\x10';
  }
  attr = '\x01';
  if (!cursor) {
    attr = uVar3;
  }
  c_put_str(attr,buf,row,col);
  return;
}

Assistant:

static void view_ability_display(struct menu *menu, int oid, bool cursor,
	int row, int col, int width)
{
	char buf[80];
	uint8_t color;
	struct player_ability *choices = menu->menu_data;

	switch (choices[oid].group) {
	case PLAYER_FLAG_SPECIAL:
		{
			strnfmt(buf, sizeof(buf), "Specialty Ability: %s",
				choices[oid].name);
			color = COLOUR_GREEN;
			break;
		}
	case PLAYER_FLAG_CLASS:
		{
			strnfmt(buf, sizeof(buf), "Class: %s",
				choices[oid].name);
			color = COLOUR_UMBER;
			break;
		}
	case PLAYER_FLAG_RACE:
		{
			strnfmt(buf, sizeof(buf), "Racial: %s",
				choices[oid].name);
			color = COLOUR_ORANGE;
			break;
		}
	default:
		{
			my_strcpy(buf, "Mysterious", sizeof(buf));
			color = COLOUR_PURPLE;
		}
	}

	/* Print it */
	c_put_str(cursor ? COLOUR_WHITE : color, buf, row, col);

}